

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O3

bool __thiscall
FilterReplayer::enqueue_create_raytracing_pipeline
          (FilterReplayer *this,Hash hash,VkRayTracingPipelineCreateInfoKHR *create_info,
          VkPipeline *pipeline)

{
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var1;
  const_iterator cVar2;
  VkPipelineLibraryCreateInfoKHR *pVVar3;
  ulong uVar4;
  uint32_t i;
  long lVar5;
  __hashtable *__h_1;
  __node_gen_type __node_gen;
  __hashtable *__h;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_50;
  VkPipeline local_48;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_40;
  Hash local_38;
  
  *pipeline = (VkPipeline)hash;
  local_40 = &(this->filter_raytracing)._M_h;
  local_38 = hash;
  cVar2 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(local_40,&local_38);
  if (cVar2.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
    uVar4 = 0xffffffffffffffff;
    lVar5 = 0x18;
    do {
      uVar4 = uVar4 + 1;
      if (create_info->stageCount <= uVar4) {
        uVar4 = 0;
        do {
          pVVar3 = create_info->pLibraryInfo;
          if (pVVar3 == (VkPipelineLibraryCreateInfoKHR *)0x0) {
            return true;
          }
          if (pVVar3->libraryCount <= uVar4) {
            return true;
          }
          local_50 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)pVVar3->pLibraries[uVar4];
          cVar2 = std::
                  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(local_40,(key_type *)&local_50);
          uVar4 = uVar4 + 1;
        } while (cVar2.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0)
        ;
        break;
      }
      local_50 = *(_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   **)((long)&create_info->pStages->sType + lVar5);
      lVar5 = lVar5 + 0x30;
      cVar2 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->filter_modules)._M_h,(key_type *)&local_50);
    } while (cVar2.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0);
  }
  if (create_info->basePipelineHandle != (VkPipeline)0x0) {
    local_50 = local_40;
    local_48 = create_info->basePipelineHandle;
    std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ();
  }
  if (create_info->stageCount != 0) {
    lVar5 = 0x18;
    uVar4 = 0;
    do {
      local_48 = *(VkPipeline *)((long)&create_info->pStages->sType + lVar5);
      local_50 = &(this->filter_modules_promoted)._M_h;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->filter_modules_promoted,&local_48,&local_50);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x30;
    } while (uVar4 < create_info->stageCount);
  }
  p_Var1 = local_40;
  pVVar3 = create_info->pLibraryInfo;
  if ((pVVar3 != (VkPipelineLibraryCreateInfoKHR *)0x0) && (pVVar3->libraryCount != 0)) {
    uVar4 = 0;
    do {
      local_48 = pVVar3->pLibraries[uVar4];
      local_50 = p_Var1;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)p_Var1,&local_48,&local_50);
      uVar4 = uVar4 + 1;
      pVVar3 = create_info->pLibraryInfo;
    } while (uVar4 < pVVar3->libraryCount);
  }
  local_50 = p_Var1;
  std::
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
            ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)p_Var1,&local_38);
  return true;
}

Assistant:

bool enqueue_create_raytracing_pipeline(Hash hash, const VkRayTracingPipelineCreateInfoKHR *create_info, VkPipeline *pipeline) override
	{
		*pipeline = fake_handle<VkPipeline>(hash);

		// We are active if we either explicitly add the pipeline, or we explicitly add one of the module dependencies.
		bool active;
		if (filter_raytracing.count(hash) != 0)
		{
			active = true;
		}
		else
		{
			active = false;
			for (uint32_t i = 0; !active && i < create_info->stageCount; i++)
				active = filter_modules.count((Hash)create_info->pStages[i].module) != 0;
			for (uint32_t i = 0; !active && create_info->pLibraryInfo && i < create_info->pLibraryInfo->libraryCount; i++)
				active = filter_raytracing.count((Hash)create_info->pLibraryInfo->pLibraries[i]) != 0;
		}

		if (!active)
			return true;

		// If the pipeline is to be emitted, promote all dependencies to be active as well.
		if (create_info->basePipelineHandle != VK_NULL_HANDLE)
			filter_raytracing.insert((Hash)create_info->basePipelineHandle);
		for (uint32_t i = 0; i < create_info->stageCount; i++)
			filter_modules_promoted.insert((Hash)create_info->pStages[i].module);
		if (create_info->pLibraryInfo)
			for (uint32_t i = 0; i < create_info->pLibraryInfo->libraryCount; i++)
				filter_raytracing.insert((Hash)create_info->pLibraryInfo->pLibraries[i]);
		filter_raytracing.insert(hash);

		return true;
	}